

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O1

char * AllocGenaHeaders(char *propertySet)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  int DbgLineNo;
  
  __s = (char *)malloc(0x76);
  DbgLineNo = 0;
  if (__s == (char *)0x0) {
    DbgLineNo = 0x1bb;
  }
  else {
    sVar2 = strlen(propertySet);
    uVar1 = snprintf(__s,0x76,"%s%s%zu%s%s%s","CONTENT-TYPE: text/xml; charset=\"utf-8\"\r\n",
                     "CONTENT-LENGTH: ",sVar2 + 2,"\r\n","NT: upnp:event\r\n",
                     "NTS: upnp:propchange\r\n");
    if (uVar1 < 0x76) {
      return __s;
    }
  }
  UpnpPrintf(UPNP_ALL,GENA,".upnp/src/gena/gena_device.c",DbgLineNo,
             "AllocGenaHeaders(): Error UPNP_E_OUTOF_MEMORY\n");
  return __s;
}

Assistant:

static char *AllocGenaHeaders(
	/*! [in] The property set string. */
	const DOMString propertySet)
{
	static const char *HEADER_LINE_1 =
		"CONTENT-TYPE: text/xml; charset=\"utf-8\"\r\n";
	static const char *HEADER_LINE_2A = "CONTENT-LENGTH: ";
	static const char *HEADER_LINE_2B = "\r\n";
	static const char *HEADER_LINE_3 = "NT: upnp:event\r\n";
	static const char *HEADER_LINE_4 = "NTS: upnp:propchange\r\n";
	char *headers = NULL;
	size_t headers_size = 0;
	int line = 0;
	int rc = 0;

	headers_size = strlen(HEADER_LINE_1) + strlen(HEADER_LINE_2A) +
		       MAX_CONTENT_LENGTH + strlen(HEADER_LINE_2B) +
		       strlen(HEADER_LINE_3) + strlen(HEADER_LINE_4) + 1;
	headers = (char *)malloc(headers_size);
	if (headers == NULL) {
		line = __LINE__;
		goto ExitFunction;
	}
	rc = snprintf(headers,
		headers_size,
		"%s%s%" PRIzu "%s%s%s",
		HEADER_LINE_1,
		HEADER_LINE_2A,
		strlen(propertySet) + 2,
		HEADER_LINE_2B,
		HEADER_LINE_3,
		HEADER_LINE_4);

ExitFunction:
	if (headers == NULL || rc < 0 || (unsigned int)rc >= headers_size) {
		UpnpPrintf(UPNP_ALL,
			GENA,
			__FILE__,
			line,
			"AllocGenaHeaders(): Error UPNP_E_OUTOF_MEMORY\n");
	}
	return headers;
}